

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

timestamp_t
duckdb::VectorTryCastOperator<duckdb::TryCastToTimestampSec>::
Operation<duckdb::date_t,duckdb::timestamp_t>
          (date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  date_t input_00;
  timestamp_t output;
  timestamp_t local_50;
  string local_48;
  
  bVar1 = TryCastToTimestampSec::Operation<duckdb::date_t,duckdb::timestamp_t>
                    (input,&local_50,false);
  if (!bVar1) {
    CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
              (&local_48,(duckdb *)(ulong)(uint)input.days,input_00);
    local_50 = HandleVectorCastError::Operation<duckdb::timestamp_t>
                         (&local_48,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (timestamp_t)local_50.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}